

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>,float,float>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false> *src,
               assign_op<float,_float> *param_3)

{
  long rows;
  long cols;
  long lVar1;
  long lVar2;
  
  rows = (src->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
         .m_rows.m_value;
  cols = (src->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
         ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
         .m_cols.m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       rows) ||
     (lVar1 = cols, lVar2 = rows,
     (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols != cols
     )) {
    PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::resize
              (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,rows,cols);
    lVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    lVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  }
  if ((lVar2 == rows) && (lVar1 == cols)) {
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<float, -1, -1>>, T1 = float, T2 = float]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}